

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O2

void __thiscall QInputDialogPrivate::ensureLineEdit(QInputDialogPrivate *this)

{
  QWidget *parent;
  QWidget *widget;
  QWidgetPrivate *pQVar1;
  long in_FS_OFFSET;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->lineEdit == (QLineEdit *)0x0) {
    parent = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
    widget = (QWidget *)operator_new(0x28);
    QLineEdit::QLineEdit((QLineEdit *)widget,parent);
    this->lineEdit = (QLineEdit *)widget;
    pQVar1 = qt_widget_private(widget);
    pQVar1->field_0x253 = pQVar1->field_0x253 | 4;
    QWidget::hide(&this->lineEdit->super_QWidget);
    QObjectPrivate::
    connect<void(QLineEdit::*)(QString_const&),void(QInputDialogPrivate::*)(QString_const&)>
              ((Object *)&stack0xffffffffffffffd8,(offset_in_QLineEdit_to_subr)this->lineEdit,
               (Object *)QLineEdit::textChanged,0,(ConnectionType)this);
    QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffd8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QInputDialogPrivate::ensureLineEdit()
{
    Q_Q(QInputDialog);
    if (!lineEdit) {
        lineEdit = new QLineEdit(q);
#ifndef QT_NO_IM
        qt_widget_private(lineEdit)->inheritsInputMethodHints = 1;
#endif
        lineEdit->hide();
        QObjectPrivate::connect(lineEdit, &QLineEdit::textChanged,
                                this, &QInputDialogPrivate::textChanged);
    }
}